

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::GetImplibGNUtoMS
          (cmGeneratorTarget *this,string *config,string *gnuName,string *out,char *newExt)

{
  pointer pcVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  size_t local_60;
  char *local_58;
  string local_50;
  
  bVar3 = HasImplibGNUtoMS(this,config);
  if ((bVar3) && (6 < gnuName->_M_string_length)) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)gnuName);
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    if ((size_t *)local_70._M_len != &local_60) {
      operator_delete((void *)local_70._M_len,local_60 + 1);
    }
    if (iVar4 == 0) {
      pcVar1 = (gnuName->_M_dataplus)._M_p;
      uVar2 = gnuName->_M_string_length;
      uVar5 = uVar2 - 6;
      if (uVar2 < uVar2 - 6) {
        uVar5 = uVar2;
      }
      __s = ".lib";
      if (newExt != (char *)0x0) {
        __s = newExt;
      }
      local_60 = strlen(__s);
      views._M_len = 2;
      views._M_array = &local_70;
      local_70._M_len = uVar5;
      local_70._M_str = pcVar1;
      local_58 = __s;
      cmCatViews_abi_cxx11_(&local_50,views);
      std::__cxx11::string::operator=((string *)out,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::GetImplibGNUtoMS(std::string const& config,
                                         std::string const& gnuName,
                                         std::string& out,
                                         const char* newExt) const
{
  if (this->HasImplibGNUtoMS(config) && gnuName.size() > 6 &&
      gnuName.substr(gnuName.size() - 6) == ".dll.a") {
    out = cmStrCat(cm::string_view(gnuName).substr(0, gnuName.size() - 6),
                   newExt ? newExt : ".lib");
    return true;
  }
  return false;
}